

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O0

uint64_t aom_sum_squares_2d_i16_nxn_sse2(int16_t *src,int stride,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  void *pvVar9;
  uint64_t uVar10;
  int in_ECX;
  int in_EDX;
  int iVar11;
  longlong in_RSI;
  long in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  __m128i a;
  __m128i v_sum_0123_d;
  __m128i v_sum_23_d;
  __m128i v_sum_01_d;
  __m128i v_sq_3_d;
  __m128i v_sq_2_d;
  __m128i v_sq_1_d;
  __m128i v_sq_0_d;
  __m128i v_val_3_w;
  __m128i v_val_2_w;
  __m128i v_val_1_w;
  __m128i v_val_0_w;
  int16_t *b;
  int c;
  __m128i v_acc_d;
  __m128i v_acc_q;
  __m128i v_zext_mask_q;
  int r;
  undefined4 local_24c;
  undefined4 local_210;
  undefined8 local_200;
  
  iVar11 = (int)in_RSI;
  local_210 = 0;
  local_200 = in_RDI;
  do {
    local_24c = 0;
    do {
      pvVar9 = (void *)(local_200 + (long)local_24c * 2);
      xx_load_128(pvVar9);
      xx_load_128((void *)((long)pvVar9 + (long)iVar11 * 2));
      xx_load_128((void *)((long)pvVar9 + (long)(iVar11 << 1) * 2));
      pvVar9 = (void *)((long)pvVar9 + (long)(iVar11 * 3) * 2);
      xx_load_128(pvVar9);
      auVar8._8_8_ = extraout_XMM0_Qb;
      auVar8._0_8_ = extraout_XMM0_Qa;
      auVar7._8_8_ = extraout_XMM0_Qb;
      auVar7._0_8_ = extraout_XMM0_Qa;
      pmaddwd(auVar8,auVar7);
      auVar6._8_8_ = extraout_XMM0_Qb_00;
      auVar6._0_8_ = extraout_XMM0_Qa_00;
      auVar5._8_8_ = extraout_XMM0_Qb_00;
      auVar5._0_8_ = extraout_XMM0_Qa_00;
      pmaddwd(auVar6,auVar5);
      auVar4._8_8_ = extraout_XMM0_Qb_01;
      auVar4._0_8_ = extraout_XMM0_Qa_01;
      auVar3._8_8_ = extraout_XMM0_Qb_01;
      auVar3._0_8_ = extraout_XMM0_Qa_01;
      pmaddwd(auVar4,auVar3);
      auVar2._8_8_ = extraout_XMM0_Qb_02;
      auVar2._0_8_ = extraout_XMM0_Qa_02;
      auVar1._8_8_ = extraout_XMM0_Qb_02;
      auVar1._0_8_ = extraout_XMM0_Qa_02;
      pmaddwd(auVar2,auVar1);
      local_24c = local_24c + 8;
    } while (local_24c < in_EDX);
    local_200 = local_200 + (long)(iVar11 << 2) * 2;
    local_210 = local_210 + 4;
  } while (local_210 < in_ECX);
  a[1] = in_RSI;
  a[0] = (longlong)pvVar9;
  uVar10 = xx_cvtsi128_si64(a);
  return uVar10;
}

Assistant:

__attribute__((noinline))
#endif
uint64_t
aom_sum_squares_2d_i16_nxn_sse2(const int16_t *src, int stride, int width,
                                int height) {
  int r = 0;

  const __m128i v_zext_mask_q = _mm_set1_epi64x(~0u);
  __m128i v_acc_q = _mm_setzero_si128();

  do {
    __m128i v_acc_d = _mm_setzero_si128();
    int c = 0;
    do {
      const int16_t *b = src + c;

      const __m128i v_val_0_w = xx_load_128(b + 0 * stride);
      const __m128i v_val_1_w = xx_load_128(b + 1 * stride);
      const __m128i v_val_2_w = xx_load_128(b + 2 * stride);
      const __m128i v_val_3_w = xx_load_128(b + 3 * stride);

      const __m128i v_sq_0_d = _mm_madd_epi16(v_val_0_w, v_val_0_w);
      const __m128i v_sq_1_d = _mm_madd_epi16(v_val_1_w, v_val_1_w);
      const __m128i v_sq_2_d = _mm_madd_epi16(v_val_2_w, v_val_2_w);
      const __m128i v_sq_3_d = _mm_madd_epi16(v_val_3_w, v_val_3_w);

      const __m128i v_sum_01_d = _mm_add_epi32(v_sq_0_d, v_sq_1_d);
      const __m128i v_sum_23_d = _mm_add_epi32(v_sq_2_d, v_sq_3_d);

      const __m128i v_sum_0123_d = _mm_add_epi32(v_sum_01_d, v_sum_23_d);

      v_acc_d = _mm_add_epi32(v_acc_d, v_sum_0123_d);
      c += 8;
    } while (c < width);

    v_acc_q = _mm_add_epi64(v_acc_q, _mm_and_si128(v_acc_d, v_zext_mask_q));
    v_acc_q = _mm_add_epi64(v_acc_q, _mm_srli_epi64(v_acc_d, 32));

    src += 4 * stride;
    r += 4;
  } while (r < height);

  v_acc_q = _mm_add_epi64(v_acc_q, _mm_srli_si128(v_acc_q, 8));
  return xx_cvtsi128_si64(v_acc_q);
}